

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O2

mi_page_t *
mi_segments_page_alloc
          (mi_heap_t *heap,mi_page_kind_t page_kind,size_t required,size_t block_size,
          mi_segments_tld_t *tld)

{
  mi_arena_id_t request_arena_id;
  mi_slice_t *slice;
  _Bool _Var1;
  _Bool _Var2;
  uintptr_t uVar3;
  mi_span_queue_t *sq;
  mi_page_t *pmVar4;
  mi_segment_t *pmVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  mi_span_queue_t *pmVar9;
  undefined4 in_register_00000034;
  size_t alignment;
  mi_segments_tld_t *pmVar10;
  ulong uVar11;
  ulong uVar12;
  mi_segment_t *segment;
  mi_segment_t *pmVar13;
  mi_heap_t *heap_00;
  bool bVar14;
  _Bool local_91;
  mi_heap_t *local_90;
  mi_segments_tld_t *local_88;
  size_t local_80;
  ulong local_78;
  ulong local_70;
  mi_span_queue_t *local_68;
  size_t target;
  
  local_78 = CONCAT44(in_register_00000034,page_kind);
  alignment = 0x10000;
  if (0x80000 < local_78) {
    alignment = 0x80000;
  }
  local_80 = required;
  uVar3 = _mi_align_up(local_78,alignment);
  uVar11 = uVar3 >> 0x10;
  request_arena_id = heap->arena_id;
  local_90 = heap;
  sq = mi_span_queue_for(uVar11,(mi_segments_tld_t *)block_size);
  uVar12 = uVar11 + (uVar11 == 0);
  local_68 = (mi_span_queue_t *)(block_size + 0x348);
  local_88 = (mi_segments_tld_t *)block_size;
  local_70 = uVar11;
  for (; pmVar9 = sq, sq <= local_68; sq = sq + 1) {
    while (slice = pmVar9->first, slice != (mi_slice_t *)0x0) {
      if (uVar12 <= slice->slice_count) {
        pmVar13 = (mi_segment_t *)((ulong)((long)slice[-1].padding + 7U) & 0xfffffffffe000000);
        if ((long)pmVar13 < 1) {
          pmVar13 = (mi_segment_t *)0x0;
        }
        _Var1 = _mi_arena_memid_is_suitable(pmVar13->memid,request_arena_id);
        if (_Var1) {
          mi_span_queue_delete(sq,slice);
          uVar11 = (ulong)slice->slice_count;
          pmVar10 = (mi_segments_tld_t *)(uVar11 - uVar12);
          tld = pmVar10;
          if (uVar12 <= uVar11 && pmVar10 != (mi_segments_tld_t *)0x0) {
            tld = local_88;
            mi_segment_span_free
                      (pmVar13,((long)slice + (-0x120 - (long)pmVar13)) / 0x60 + uVar12,
                       (size_t)pmVar10,false,local_88);
            slice->slice_count = (uint32_t)uVar12;
            uVar11 = uVar12;
          }
          pmVar4 = mi_segment_span_allocate
                             (pmVar13,((long)slice + (-0x120 - (long)pmVar13)) / 0x60,uVar11);
          if (pmVar4 != (mi_page_t *)0x0) {
            pmVar5 = (mi_segment_t *)((ulong)((long)pmVar4[-1].padding + 7) & 0xfffffffffe000000);
            pmVar13 = (mi_segment_t *)0x0;
            if (0 < (long)pmVar5) {
              pmVar13 = pmVar5;
            }
            mi_segment_try_purge(pmVar13,false);
            return pmVar4;
          }
          mi_segment_span_free_coalesce(slice,local_88);
          goto LAB_00433c7d;
        }
      }
      pmVar9 = (mi_span_queue_t *)&slice->next;
    }
  }
LAB_00433c7d:
  pmVar10 = local_88;
  target = 0;
  _Var1 = segment_count_is_within_target(local_88,&target);
  heap_00 = local_90;
  if (!_Var1) {
    mi_segments_try_abandon_to_target(local_90,target,pmVar10);
  }
  local_91 = false;
  lVar6 = mi_option_get_clamp(mi_option_max_segment_reclaim,0,100);
  if (lVar6 != 0) {
    uVar11 = pmVar10->subproc->abandoned_count;
    if (uVar11 != 0) {
      if (uVar11 < 0x2711) {
        uVar12 = (lVar6 * uVar11) / 100;
      }
      else {
        uVar12 = (uVar11 / 100) * lVar6;
      }
      uVar7 = 0x400;
      if (uVar12 < 0x400) {
        uVar7 = uVar12;
      }
      lVar8 = uVar7 + (uVar7 == 0);
      lVar6 = 8;
      if (7 < uVar12) {
        lVar6 = lVar8;
      }
      if (uVar11 < 9) {
        lVar6 = lVar8;
      }
      _mi_arena_field_cursor_init(heap_00,pmVar10->subproc,false,(mi_arena_field_cursor_t *)&target)
      ;
      bVar14 = true;
      do {
        while( true ) {
          _Var1 = segment_count_is_within_target(pmVar10,(size_t *)0x0);
          if (((!_Var1) || (lVar6 < 1)) ||
             (pmVar13 = _mi_arena_segment_clear_abandoned_next((mi_arena_field_cursor_t *)&target),
             pmVar13 == (mi_segment_t *)0x0)) goto LAB_00433e28;
          pmVar13->abandoned_visits = pmVar13->abandoned_visits + 1;
          _Var1 = _mi_heap_memid_is_suitable(heap_00,pmVar13->memid);
          _Var2 = mi_segment_check_free(pmVar13,local_70,local_80,pmVar10);
          heap_00 = local_90;
          if (pmVar13->used != 0) break;
LAB_00433de6:
          lVar6 = lVar6 + -1;
          tld = pmVar10;
          mi_segment_reclaim(pmVar13,local_90,0,(_Bool *)0x0,pmVar10);
        }
        if (_Var2 && _Var1) goto LAB_00433e05;
        if (3 < pmVar13->abandoned_visits && _Var1) goto LAB_00433de6;
        mi_segment_try_purge(pmVar13,false);
        _mi_arena_segment_mark_abandoned(pmVar13);
        heap_00 = local_90;
      } while( true );
    }
  }
LAB_00433e42:
  tld = (mi_segments_tld_t *)0x0;
  pmVar13 = mi_segment_alloc(0,0,heap_00->arena_id,pmVar10,(mi_page_t **)0x0);
  if (pmVar13 == (mi_segment_t *)0x0) {
    return (mi_page_t *)0x0;
  }
LAB_00433e5d:
  pmVar4 = mi_segments_page_alloc(heap_00,(mi_page_kind_t)local_78,local_80,(size_t)pmVar10,tld);
  return pmVar4;
LAB_00433e05:
  tld = pmVar10;
  pmVar13 = mi_segment_reclaim(pmVar13,local_90,local_80,&local_91,pmVar10);
  bVar14 = pmVar13 == (mi_segment_t *)0x0;
LAB_00433e28:
  _mi_arena_field_cursor_done((mi_arena_field_cursor_t *)&target);
  if ((local_91 & 1U) != 0) {
    return (mi_page_t *)0x0;
  }
  if (!bVar14) goto LAB_00433e5d;
  goto LAB_00433e42;
}

Assistant:

static mi_page_t* mi_segments_page_alloc(mi_heap_t* heap, mi_page_kind_t page_kind, size_t required, size_t block_size, mi_segments_tld_t* tld)
{
  mi_assert_internal(required <= MI_LARGE_OBJ_SIZE_MAX && page_kind <= MI_PAGE_LARGE);

  // find a free page
  size_t page_size = _mi_align_up(required, (required > MI_MEDIUM_PAGE_SIZE ? MI_MEDIUM_PAGE_SIZE : MI_SEGMENT_SLICE_SIZE));
  size_t slices_needed = page_size / MI_SEGMENT_SLICE_SIZE;
  mi_assert_internal(slices_needed * MI_SEGMENT_SLICE_SIZE == page_size);
  mi_page_t* page = mi_segments_page_find_and_allocate(slices_needed, heap->arena_id, tld); //(required <= MI_SMALL_SIZE_MAX ? 0 : slices_needed), tld);
  if (page==NULL) {
    // no free page, allocate a new segment and try again
    if (mi_segment_reclaim_or_alloc(heap, slices_needed, block_size, tld) == NULL) {
      // OOM or reclaimed a good page in the heap
      return NULL;
    }
    else {
      // otherwise try again
      return mi_segments_page_alloc(heap, page_kind, required, block_size, tld);
    }
  }
  mi_assert_internal(page != NULL && page->slice_count*MI_SEGMENT_SLICE_SIZE == page_size);
  mi_assert_internal(_mi_ptr_segment(page)->thread_id == _mi_thread_id());
  mi_segment_try_purge(_mi_ptr_segment(page), false);
  return page;
}